

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O1

void raviX_set_remove(Set *set,void *key)

{
  uint32_t hash;
  SetEntry *pSVar1;
  
  hash = (*set->hash_function)(key);
  pSVar1 = raviX_set_search_pre_hashed(set,hash,key);
  if (pSVar1 != (SetEntry *)0x0) {
    pSVar1->key = &deleted_key_value;
    set->entries = set->entries - 1;
    set->deleted_entries = set->deleted_entries + 1;
  }
  return;
}

Assistant:

void raviX_set_remove(Set *set, const void *key)
{
	SetEntry *entry;

	entry = raviX_set_search(set, key);

	raviX_set_remove_entry(set, entry);
}